

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyWbrToSpace(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *node_00;
  Node *text;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    if (((next == (Node *)0x0) || (next->tag == (Dict *)0x0)) || (next->tag->id != TidyTag_WBR)) {
      if (next->content != (Node *)0x0) {
        prvTidyWbrToSpace(doc,next->content);
      }
    }
    else {
      node_00 = prvTidyNewLiteralTextNode(doc->lexer," ");
      prvTidyInsertNodeAfterElement(next,node_00);
      prvTidyRemoveNode(next);
      prvTidyFreeNode(doc,next);
    }
  }
  return;
}

Assistant:

void TY_(WbrToSpace)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (nodeIsWBR(node))
        {
            Node* text;
            text = TY_(NewLiteralTextNode)(doc->lexer, " ");
            TY_(InsertNodeAfterElement)(node, text);
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(WbrToSpace)(doc, node->content);

        node = next;
   }
}